

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

ITexture * __thiscall
irr::video::COpenGL3DriverBase::addRenderTargetTexture
          (COpenGL3DriverBase *this,dimension2d<unsigned_int> *size,path *name,ECOLOR_FORMAT format)

{
  undefined1 uVar1;
  ITexture *texture;
  undefined4 in_ECX;
  long *in_RDI;
  COpenGL3Texture *renderTargetTexture;
  bool generateMipLevels;
  COpenGL3DriverBase *in_stack_00000110;
  ECOLOR_FORMAT in_stack_00000118;
  E_TEXTURE_TYPE in_stack_0000011c;
  dimension2d<unsigned_int> *in_stack_00000120;
  path *in_stack_00000128;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *in_stack_00000130;
  ITexture *pIVar2;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  byte bVar4;
  
  uVar1 = (**(code **)(*in_RDI + 0x220))(in_RDI,0x10);
  uVar3 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffe0) & 0x1ffffff;
  (**(code **)(*in_RDI + 0x218))(in_RDI,0x10,0);
  texture = (ITexture *)operator_new(0x108);
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::COpenGLCoreTexture
            (in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_0000011c,
             in_stack_00000118,in_stack_00000110);
  pIVar2 = texture;
  CNullDriver::addTexture((CNullDriver *)CONCAT44(in_ECX,uVar3),texture);
  bVar4 = (byte)(uVar3 >> 0x18);
  IReferenceCounted::drop((IReferenceCounted *)texture);
  (**(code **)(*in_RDI + 0x218))(in_RDI,0x10,bVar4 & 1);
  return pIVar2;
}

Assistant:

ITexture *COpenGL3DriverBase::addRenderTargetTexture(const core::dimension2d<u32> &size,
		const io::path &name, const ECOLOR_FORMAT format)
{
	// disable mip-mapping
	bool generateMipLevels = getTextureCreationFlag(ETCF_CREATE_MIP_MAPS);
	setTextureCreationFlag(ETCF_CREATE_MIP_MAPS, false);

	COpenGL3Texture *renderTargetTexture = new COpenGL3Texture(name, size, ETT_2D, format, this);
	addTexture(renderTargetTexture);
	renderTargetTexture->drop();

	// restore mip-mapping
	setTextureCreationFlag(ETCF_CREATE_MIP_MAPS, generateMipLevels);

	return renderTargetTexture;
}